

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
 __thiscall
kj::
Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
::exclusiveJoin(Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
                *this,Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
                      *other,SourceLocation location)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *next;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *in_RDX;
  Own<kj::_::ExclusiveJoinPromiseNode,_kj::_::PromiseDisposer> local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *local_20;
  Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  *other_local;
  Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  *this_local;
  
  local_20 = in_RDX;
  other_local = other;
  this_local = this;
  next = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>
                   ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)other);
  params = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(local_20);
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ExclusiveJoinPromiseNode,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
            ((PromiseDisposer *)&local_30,next,params,&location);
  Own<kj::_::PromiseNode,kj::_::PromiseDisposer>::Own<kj::_::ExclusiveJoinPromiseNode,void>
            ((Own<kj::_::PromiseNode,kj::_::PromiseDisposer> *)&local_28,&local_30);
  Promise(this,false,(OwnPromiseNode *)&local_28);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own(&local_28);
  Own<kj::_::ExclusiveJoinPromiseNode,_kj::_::PromiseDisposer>::~Own(&local_30);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::exclusiveJoin(Promise<T>&& other, SourceLocation location) {
  return Promise(false, _::PromiseDisposer::appendPromise<_::ExclusiveJoinPromiseNode>(
      kj::mv(node), kj::mv(other.node), location));
}